

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImVector<ImGuiOldColumns>::clear_destruct(ImVector<ImGuiOldColumns> *this)

{
  int *in_RDI;
  int n;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < *in_RDI; iVar1 = iVar1 + 1) {
    ImGuiOldColumns::~ImGuiOldColumns((ImGuiOldColumns *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  }
  clear((ImVector<ImGuiOldColumns> *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  return;
}

Assistant:

inline int          size() const                        { return Size; }